

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

QVariant * operator+(QVariant *__return_storage_ptr__,QVariant *arg1,QVariant *arg2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  QDateTime a1;
  QDateTime a2;
  undefined1 local_70 [8];
  undefined1 *local_68;
  undefined1 *local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  iVar1 = QVariant::typeId(arg1);
  iVar2 = QVariant::typeId(arg2);
  if (iVar1 != iVar2) {
    operator+();
  }
  iVar1 = QVariant::typeId(arg1);
  if (iVar1 == 0x10) {
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    QDate::QDate((QDate *)local_70,100,1,1);
    QDateTime::date();
    QDate::daysTo((QDate)local_70);
    QDateTime::addDays((longlong)&local_68);
    QDateTime::~QDateTime((QDateTime *)local_58.data);
    local_58._0_4_ = QDateTime::time();
    QDateTime::time();
    uVar4 = QTime::addMSecs((int)&local_58);
    QDateTime::setTime((QDateTime *)&local_68,uVar4,1);
    QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_68);
    QVariant::operator=(__return_storage_ptr__,(QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_58);
    QDateTime::~QDateTime((QDateTime *)&local_68);
    QDateTime::~QDateTime((QDateTime *)&local_60);
  }
  else {
    if (iVar1 == 6) {
      dVar5 = (double)QVariant::toDouble((bool *)arg1);
      dVar6 = (double)QVariant::toDouble((bool *)arg2);
      QVariant::QVariant((QVariant *)&local_58,dVar6 + dVar5);
    }
    else {
      if (iVar1 != 2) goto LAB_004784ef;
      uVar3 = QVariant::toInt((bool *)arg1);
      iVar1 = QVariant::toInt((bool *)arg2);
      if (iVar1 < (int)(uVar3 ^ 0x7fffffff) || (int)uVar3 < 1) {
        if ((int)(-0x80000000 - uVar3) < iVar1 || -1 < (int)uVar3) {
          iVar1 = iVar1 + uVar3;
        }
        else {
          iVar1 = -0x80000000;
        }
      }
      else {
        iVar1 = 0x7fffffff;
      }
      QVariant::QVariant((QVariant *)&local_58,iVar1);
    }
    QVariant::operator=(__return_storage_ptr__,(QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_58);
  }
LAB_004784ef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant operator+(const QVariant &arg1, const QVariant &arg2)
{
    QVariant ret;
    if (Q_UNLIKELY(arg1.userType() != arg2.userType()))
        qWarning("QAbstractSpinBox: Internal error: Different types (%s vs %s) (%s:%d)",
                 arg1.typeName(), arg2.typeName(), __FILE__, __LINE__);
    switch (arg1.userType()) {
    case QMetaType::Int: {
        const int int1 = arg1.toInt();
        const int int2 = arg2.toInt();
        if (int1 > 0 && (int2 >= INT_MAX - int1)) {
            // The increment overflows
            ret = QVariant(INT_MAX);
        } else if (int1 < 0 && (int2 <= INT_MIN - int1)) {
            // The increment underflows
            ret = QVariant(INT_MIN);
        } else {
            ret = QVariant(int1 + int2);
        }
        break;
    }
    case QMetaType::Double: ret = QVariant(arg1.toDouble() + arg2.toDouble()); break;
#if QT_CONFIG(datetimeparser)
    case QMetaType::QDateTime: {
        QDateTime a2 = arg2.toDateTime();
        QDateTime a1 = arg1.toDateTime().addDays(QDATETIMEEDIT_DATE_MIN.daysTo(a2.date()));
        a1.setTime(a1.time().addMSecs(a2.time().msecsSinceStartOfDay()));
        ret = QVariant(a1);
        break;
    }
#endif // datetimeparser
    default: break;
    }
    return ret;
}